

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

bool __thiscall re2::Tester::TestInput(Tester *this,StringPiece *text)

{
  bool bVar1;
  int iVar2;
  undefined1 local_30 [8];
  StringPiece sp;
  bool okay;
  StringPiece *text_local;
  Tester *this_local;
  
  sp._15_1_ = TestInputInContext(this,text,text);
  iVar2 = StringPiece::size(text);
  if (0 < iVar2) {
    StringPiece::StringPiece((StringPiece *)local_30);
    local_30 = (undefined1  [8])text->ptr_;
    sp.ptr_._0_4_ = text->length_;
    StringPiece::remove_prefix((StringPiece *)local_30,1);
    bVar1 = TestInputInContext(this,(StringPiece *)local_30,text);
    sp._15_1_ = (sp._15_1_ & 1 & bVar1) != 0;
    local_30 = (undefined1  [8])text->ptr_;
    sp.ptr_._0_4_ = text->length_;
    StringPiece::remove_suffix((StringPiece *)local_30,1);
    bVar1 = TestInputInContext(this,(StringPiece *)local_30,text);
    sp._15_1_ = (sp._15_1_ & 1 & bVar1) != 0;
  }
  return (bool)(sp._15_1_ & 1);
}

Assistant:

bool Tester::TestInput(const StringPiece& text) {
  bool okay = TestInputInContext(text, text);
  if (text.size() > 0) {
    StringPiece sp;
    sp = text;
    sp.remove_prefix(1);
    okay &= TestInputInContext(sp, text);
    sp = text;
    sp.remove_suffix(1);
    okay &= TestInputInContext(sp, text);
  }
  return okay;
}